

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

UnicodeString * icu_63::tokenString(UnicodeString *__return_storage_ptr__,tokenType tok)

{
  wchar16 srcChar;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003daac8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  srcChar = L'~';
  if (tok - tVariableN < 5) {
    srcChar = L"nifvt"[tok - tVariableN];
  }
  UnicodeString::append(__return_storage_ptr__,srcChar);
  return __return_storage_ptr__;
}

Assistant:

static UnicodeString tokenString(tokenType tok) {
    UnicodeString s;
    switch (tok) {
      case tVariableN:
        s.append(LOW_N); break;
      case tVariableI:
        s.append(LOW_I); break;
      case tVariableF:
        s.append(LOW_F); break;
      case tVariableV:
        s.append(LOW_V); break;
      case tVariableT:
        s.append(LOW_T); break;
      default:
        s.append(TILDE);
    }
    return s;
}